

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

void cf_aes_init(cf_aes_context *ctx,uint8_t *key,size_t nkey)

{
  uint32_t uStack_20;
  
  memset(ctx,0,0xf4);
  if (nkey == 0x10) {
    uStack_20 = 10;
  }
  else if (nkey == 0x20) {
    uStack_20 = 0xe;
  }
  else {
    if (nkey != 0x18) {
      abort();
    }
    uStack_20 = 0xc;
  }
  ctx->rounds = uStack_20;
  aes_schedule(ctx,key,nkey);
  return;
}

Assistant:

void cf_aes_init(cf_aes_context *ctx, const uint8_t *key, size_t nkey)
{
  memset(ctx, 0, sizeof *ctx);

  switch (nkey)
  {
#if CF_AES_MAXROUNDS >= AES128_ROUNDS
    case 16:
      ctx->rounds = AES128_ROUNDS;
      aes_schedule(ctx, key, nkey);
      break;
#endif

#if CF_AES_MAXROUNDS >= AES192_ROUNDS
    case 24:
      ctx->rounds = AES192_ROUNDS;
      aes_schedule(ctx, key, nkey);
      break;
#endif

#if CF_AES_MAXROUNDS >= AES256_ROUNDS
    case 32:
      ctx->rounds = AES256_ROUNDS;
      aes_schedule(ctx, key, nkey);
      break;
#endif

    default:
      abort();
  }
}